

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::WritePools(cmLocalNinjaGenerator *this,ostream *os)

{
  string_view arg;
  cmValue os_00;
  bool bVar1;
  int iVar2;
  cmake *this_00;
  cmState *this_01;
  cmMakefile *this_02;
  string *this_03;
  long lVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128 [36];
  uint local_104;
  long lStack_100;
  uint jobs;
  size_type eq;
  string *pool;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pools;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  string *local_60;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue jobpools;
  ostream *os_local;
  cmLocalNinjaGenerator *this_local;
  
  jobpools.Value = (string *)os;
  cmGlobalNinjaGenerator::WriteDivider(os);
  this_00 = GetCMakeInstance(this);
  this_01 = cmake::GetState(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"JOB_POOLS",&local_41);
  local_20 = cmState::GetGlobalProperty(this_01,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    this_02 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"CMAKE_JOB_POOLS",&local_81);
    local_60 = (string *)cmMakefile::GetDefinition(this_02,&local_80);
    local_20 = (cmValue)local_60;
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  os_00 = jobpools;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Pools defined by global property JOB_POOLS",
               (allocator<char> *)
               ((long)&pools.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmGlobalNinjaGenerator::WriteComment((ostream *)os_00.Value,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pools.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    this_03 = cmValue::operator*[abi_cxx11_(&local_20);
    arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_03);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c8,arg,false);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_c8);
    pool = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c8);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&pool), bVar1) {
      eq = (size_type)
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      lStack_100 = std::__cxx11::string::find((char)eq,0x3d);
      if (lStack_100 == -1) {
LAB_006cb689:
        std::operator+(&local_148,"Invalid pool defined by property \'JOB_POOLS\': ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eq);
        cmSystemTools::Error(&local_148);
        std::__cxx11::string::~string((string *)&local_148);
      }
      else {
        lVar3 = std::__cxx11::string::c_str();
        iVar2 = __isoc99_sscanf(lVar3 + lStack_100,"=%u",&local_104);
        if (iVar2 != 1) goto LAB_006cb689;
        poVar4 = std::operator<<((ostream *)jobpools.Value,"pool ");
        std::__cxx11::string::substr((ulong)local_128,eq);
        poVar4 = std::operator<<(poVar4,local_128);
        poVar4 = std::operator<<(poVar4,"\n  depth = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_104);
        std::operator<<(poVar4,"\n\n");
        std::__cxx11::string::~string(local_128);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c8);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::WritePools(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);

  cmValue jobpools =
    this->GetCMakeInstance()->GetState()->GetGlobalProperty("JOB_POOLS");
  if (!jobpools) {
    jobpools = this->GetMakefile()->GetDefinition("CMAKE_JOB_POOLS");
  }
  if (jobpools) {
    cmGlobalNinjaGenerator::WriteComment(
      os, "Pools defined by global property JOB_POOLS");
    std::vector<std::string> pools = cmExpandedList(*jobpools);
    for (std::string const& pool : pools) {
      const std::string::size_type eq = pool.find('=');
      unsigned int jobs;
      if (eq != std::string::npos &&
          sscanf(pool.c_str() + eq, "=%u", &jobs) == 1) {
        os << "pool " << pool.substr(0, eq) << "\n  depth = " << jobs
           << "\n\n";
      } else {
        cmSystemTools::Error("Invalid pool defined by property 'JOB_POOLS': " +
                             pool);
      }
    }
  }
}